

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O0

uint __thiscall NALUnit::extractUEGolombCode(NALUnit *this)

{
  bool bVar1;
  uint uVar2;
  BitStreamException *this_00;
  uint local_14;
  uint cnt;
  NALUnit *this_local;
  
  local_14 = 0;
  while( true ) {
    bVar1 = BitStreamReader::getBit(&this->bitReader);
    if (bVar1) break;
    local_14 = local_14 + 1;
  }
  if (0x20 < local_14) {
    this_00 = (BitStreamException *)__cxa_allocate_exception(8);
    memset(this_00,0,8);
    BitStreamException::BitStreamException(this_00);
    __cxa_throw(this_00,&BitStreamException::typeinfo,BitStreamException::~BitStreamException);
  }
  uVar2 = BitStreamReader::getBits(&this->bitReader,local_14);
  return (1 << ((byte)local_14 & 0x1f)) + -1 + uVar2;
}

Assistant:

unsigned NALUnit::extractUEGolombCode()
{
    unsigned cnt = 0;
    for (; bitReader.getBit() == 0; cnt++)
        ;
    if (cnt > INT_BIT)
        THROW_BITSTREAM_ERR;
    return (1 << cnt) - 1 + bitReader.getBits(cnt);
}